

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BCD.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     daas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (uint8_t *al,Context *context)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  bool top_exceeded_threshold;
  Context *context_local;
  uint8_t *al_local;
  
  bVar1 = *al;
  bVar2 = Flags::flag<(InstructionSet::x86::Flag)1>(&context->flags);
  bVar3 = 0x99;
  if (bVar2) {
    bVar3 = 0x9f;
  }
  if ((9 < (*al & 0xf)) ||
     (bVar2 = Flags::flag<(InstructionSet::x86::Flag)1>(&context->flags), bVar2)) {
    *al = *al + '\x06';
    Flags::set_from<(InstructionSet::x86::Flag)1>(&context->flags,1);
  }
  if ((bVar3 < bVar1) || (bVar2 = Flags::flag<(InstructionSet::x86::Flag)0>(&context->flags), bVar2)
     ) {
    *al = *al + '`';
    Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,1);
  }
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,*al);
  return;
}

Assistant:

void daas(
	uint8_t &al,
	ContextT &context
) {
	bool top_exceeded_threshold;
	if constexpr (ContextT::model == Model::i8086) {
		top_exceeded_threshold = al > (context.flags.template flag<Flag::AuxiliaryCarry>() ? 0x9f : 0x99);
	} else {
		top_exceeded_threshold = al > 0x99;
	}

	if((al & 0x0f) > 0x09 || context.flags.template flag<Flag::AuxiliaryCarry>()) {
		if constexpr (add) al += 0x06; else al -= 0x06;
		context.flags.template set_from<Flag::AuxiliaryCarry>(1);
	}

	if(top_exceeded_threshold || context.flags.template flag<Flag::Carry>()) {
		if constexpr (add) al += 0x60; else al -= 0x60;
		context.flags.template set_from<Flag::Carry>(1);
	}

	context.flags.template set_from<uint8_t, Flag::Zero, Flag::Sign, Flag::ParityOdd>(al);
}